

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

TBuiltInParseables *
anon_unknown.dwarf_8f1b29::CreateBuiltInParseables(TInfoSink *infoSink,EShSource source)

{
  undefined4 in_register_00000034;
  EShSource source_local;
  TInfoSink *infoSink_local;
  
  if (source == EShSourceGlsl) {
    infoSink_local =
         (TInfoSink *)
         glslang::TBuiltIns::operator_new((TBuiltIns *)0x390,CONCAT44(in_register_00000034,source));
    glslang::TBuiltIns::TBuiltIns((TBuiltIns *)infoSink_local);
  }
  else if (source == EShSourceHlsl) {
    infoSink_local =
         (TInfoSink *)
         glslang::TBuiltInParseablesHlsl::operator_new
                   ((TBuiltInParseablesHlsl *)0x260,CONCAT44(in_register_00000034,source));
    glslang::TBuiltInParseablesHlsl::TBuiltInParseablesHlsl
              ((TBuiltInParseablesHlsl *)infoSink_local);
  }
  else {
    glslang::TInfoSinkBase::message
              (&infoSink->info,EPrefixInternalError,"Unable to determine source language");
    infoSink_local = (TInfoSink *)0x0;
  }
  return (TBuiltInParseables *)infoSink_local;
}

Assistant:

TBuiltInParseables* CreateBuiltInParseables(TInfoSink& infoSink, EShSource source)
{
    switch (source) {
    case EShSourceGlsl: return new TBuiltIns();              // GLSL builtIns
#ifdef ENABLE_HLSL
    case EShSourceHlsl: return new TBuiltInParseablesHlsl(); // HLSL intrinsics
#endif

    default:
        infoSink.info.message(EPrefixInternalError, "Unable to determine source language");
        return nullptr;
    }
}